

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deconvolutiondepthwise.cpp
# Opt level: O3

int ncnn::deconvolutiondepthwise
              (Mat *bottom_blob,Mat *top_blob,Mat *weight_data,Mat *bias_data,int kernel_w,
              int kernel_h,int stride_w,int stride_h,int dilation_w,int dilation_h,int group,
              int activation_type,Mat *activation_params,Option *opt)

{
  float fVar1;
  uint uVar2;
  uint uVar3;
  ulong uVar4;
  float *pfVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  bool bVar9;
  long lVar10;
  uint uVar11;
  int iVar12;
  int extraout_EAX;
  ulong uVar13;
  int iVar14;
  int iVar15;
  void *pvVar16;
  int iVar17;
  long lVar18;
  ulong uVar19;
  ulong uVar20;
  ulong uVar21;
  void *pvVar22;
  void *pvVar23;
  uint uVar24;
  size_type __n;
  undefined4 uVar25;
  float fVar26;
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  float fVar29;
  float fVar30;
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  int iVar35;
  undefined1 auVar34 [16];
  int size_1;
  int size;
  vector<int,_std::allocator<int>_> _space_ofs;
  ulong local_1b0;
  ulong local_1a0;
  void *local_198;
  allocator_type local_181;
  ulong local_180;
  ulong local_178;
  ulong local_170;
  ulong local_168;
  ulong local_160;
  ulong local_158;
  ulong local_150;
  undefined1 local_148 [16];
  Mat *local_138;
  ulong local_130;
  ulong local_128;
  void *local_120;
  void *local_118;
  long local_110;
  long local_108;
  ulong local_100;
  int local_f4;
  int local_f0;
  int local_ec;
  undefined1 local_e8 [16];
  undefined1 local_d8 [16];
  void *local_c0;
  long local_b8;
  void *local_b0;
  undefined1 local_a8 [16];
  long local_90;
  void *local_88;
  ulong local_80;
  long local_78;
  ulong local_70;
  ulong local_68;
  ulong local_60;
  void *local_58;
  long local_50;
  vector<int,_std::allocator<int>_> local_48;
  
  local_e8._8_8_ = local_e8._0_8_;
  local_e8._0_8_ = bottom_blob;
  uVar2 = bottom_blob->c;
  iVar12 = top_blob->w;
  local_170 = CONCAT44(local_170._4_4_,top_blob->c);
  uVar24 = kernel_h * kernel_w;
  __n = (size_type)(int)uVar24;
  local_138 = bias_data;
  std::vector<int,_std::allocator<int>_>::vector(&local_48,__n,&local_181);
  if (0 < kernel_h) {
    iVar14 = 0;
    iVar15 = 0;
    iVar17 = 0;
    do {
      if (0 < kernel_w) {
        lVar18 = 0;
        do {
          local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start[iVar14 + lVar18] = iVar15;
          iVar15 = iVar15 + dilation_w;
          lVar18 = lVar18 + 1;
        } while (kernel_w != (int)lVar18);
        iVar14 = iVar14 + (int)lVar18;
      }
      iVar15 = iVar15 + (iVar12 * dilation_h - dilation_w * kernel_w);
      iVar17 = iVar17 + 1;
    } while (iVar17 != kernel_h);
  }
  if ((int)local_170 == group && uVar2 == group) {
    uVar13 = (ulong)uVar2;
    if (0 < group) {
      local_108 = *(long *)(local_e8._0_8_ + 0x40) * *(long *)(local_e8._0_8_ + 0x10);
      local_110 = *(long *)local_e8._0_8_;
      pvVar23 = weight_data->data;
      iVar12 = top_blob->w;
      uVar4 = top_blob->elemsize;
      local_180 = top_blob->cstep * uVar4;
      uVar20 = (long)top_blob->h * (long)iVar12;
      pvVar16 = top_blob->data;
      local_120 = local_138->data;
      uVar13 = (uVar4 * uVar20 + 0xf & 0xfffffffffffffff0) / uVar4;
      if (top_blob->dims == 4) {
        uVar13 = uVar20;
      }
      uVar11 = (int)uVar13 * top_blob->d;
      uVar13 = CONCAT44(0,uVar11);
      local_168 = (ulong)(uint)(top_blob->h * iVar12);
      lVar18 = uVar13 - 1;
      uVar2 = *(uint *)(local_e8._0_8_ + 0x2c);
      uVar3 = *(uint *)(local_e8._0_8_ + 0x30);
      local_170 = (ulong)stride_w;
      local_150 = (ulong)(uint)group;
      local_100 = CONCAT71(local_100._1_7_,
                           (long)local_138->c * local_138->cstep == 0 || local_120 == (void *)0x0);
      local_a8._0_8_ = uVar13;
      local_158 = (ulong)(uVar11 + 3 & 0xfffffffc);
      auVar31._8_4_ = (int)lVar18;
      auVar31._0_8_ = lVar18;
      auVar31._12_4_ = (int)((ulong)lVar18 >> 0x20);
      auVar31 = auVar31 ^ _DAT_005a24a0;
      uVar20 = (long)pvVar16 + 0xc;
      local_1a0 = 0;
      auVar32 = _DAT_005a25a0;
      auVar33 = _DAT_005a25b0;
      auVar34 = _DAT_005a24a0;
      local_118 = pvVar16;
      local_e8 = auVar31;
      do {
        uVar25 = 0;
        if ((char)local_100 == '\0') {
          uVar25 = *(undefined4 *)((long)local_120 + local_1a0 * 4);
        }
        if (0 < (int)local_a8._0_4_) {
          uVar13 = 0;
          do {
            auVar28._8_4_ = (int)uVar13;
            auVar28._0_8_ = uVar13;
            auVar28._12_4_ = (int)(uVar13 >> 0x20);
            auVar27 = (auVar28 | auVar33) ^ auVar34;
            iVar15 = auVar31._0_4_;
            bVar9 = iVar15 < auVar27._0_4_;
            iVar14 = auVar27._4_4_;
            iVar17 = auVar31._4_4_;
            if ((bool)(~(iVar17 < iVar14 || iVar14 == iVar17 && bVar9) & 1)) {
              *(undefined4 *)((uVar20 - 0xc) + uVar13 * 4) = uVar25;
            }
            if (iVar17 >= iVar14 && (iVar14 != iVar17 || !bVar9)) {
              *(undefined4 *)((uVar20 - 8) + uVar13 * 4) = uVar25;
            }
            auVar27 = (auVar28 | auVar32) ^ auVar34;
            iVar14 = auVar27._4_4_;
            if (iVar14 <= iVar17 && (iVar14 != iVar17 || auVar27._0_4_ <= iVar15)) {
              *(undefined4 *)((uVar20 - 4) + uVar13 * 4) = uVar25;
              *(undefined4 *)(uVar20 + uVar13 * 4) = uVar25;
            }
            uVar13 = uVar13 + 4;
          } while (local_158 != uVar13);
        }
        local_148._0_8_ = pvVar16;
        if (0 < (int)uVar3) {
          uVar13 = 0;
          do {
            if (0 < (int)uVar2) {
              uVar19 = 0;
              do {
                if (0 < (int)uVar24) {
                  lVar18 = uVar19 * local_170 * 4 +
                           uVar13 * (long)stride_h * uVar4 * (long)iVar12 + local_180 * local_1a0;
                  fVar26 = *(float *)(local_108 * local_1a0 + local_110 +
                                      uVar13 * (long)(int)uVar2 * 4 + uVar19 * 4);
                  uVar21 = 0;
                  do {
                    *(float *)((long)local_118 +
                              (long)local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                    super__Vector_impl_data._M_start[uVar21] * 4 + lVar18) =
                         *(float *)((long)pvVar23 + uVar21 * 4) * fVar26 +
                         *(float *)((long)local_118 +
                                   (long)local_48.super__Vector_base<int,_std::allocator<int>_>.
                                         _M_impl.super__Vector_impl_data._M_start[uVar21] * 4 +
                                   lVar18);
                    uVar21 = uVar21 + 1;
                  } while (uVar24 != uVar21);
                }
                uVar19 = uVar19 + 1;
              } while (uVar19 != uVar2);
            }
            uVar13 = uVar13 + 1;
          } while (uVar13 != uVar3);
        }
        local_178 = uVar20;
        if (0 < (int)local_168) {
          pfVar5 = (float *)activation_params->data;
          uVar13 = 0;
          uVar19 = local_168;
          do {
            fVar26 = *(float *)((long)pvVar16 + uVar13 * 4);
            fVar30 = fVar26;
            switch(activation_type) {
            case 1:
              if (fVar26 <= 0.0) {
                fVar30 = 0.0;
              }
              break;
            case 2:
              fVar30 = (float)(~-(uint)(0.0 < fVar26) & (uint)*pfVar5 |
                              -(uint)(0.0 < fVar26) & 0x3f800000) * fVar26;
              break;
            case 3:
              if (fVar26 <= *pfVar5) {
                fVar26 = *pfVar5;
              }
              fVar30 = pfVar5[1];
              if (fVar26 <= pfVar5[1]) {
                fVar30 = fVar26;
              }
              break;
            case 4:
              if (88.37626 <= fVar26) {
                fVar26 = 88.37626;
              }
              local_160 = uVar13;
              fVar26 = expf((float)(-(uint)(fVar26 < -88.37626) & 0x42b0c0a5 |
                                   ~-(uint)(fVar26 < -88.37626) & ((uint)fVar26 ^ auVar34._0_4_)));
              pvVar16 = (void *)local_148._0_8_;
              uVar20 = local_178;
              uVar13 = local_160;
              uVar19 = local_168;
              auVar31 = local_e8;
              auVar32 = _DAT_005a25a0;
              auVar33 = _DAT_005a25b0;
              auVar34 = _DAT_005a24a0;
              fVar30 = 1.0 / (fVar26 + 1.0);
              break;
            case 5:
              local_160 = uVar13;
              local_d8 = ZEXT416((uint)fVar26);
              fVar26 = expf(fVar26);
              fVar26 = logf(fVar26 + 1.0);
              fVar26 = tanhf(fVar26);
              pvVar16 = (void *)local_148._0_8_;
              uVar20 = local_178;
              uVar13 = local_160;
              uVar19 = local_168;
              auVar31 = local_e8;
              auVar32 = _DAT_005a25a0;
              auVar33 = _DAT_005a25b0;
              auVar34 = _DAT_005a24a0;
              fVar30 = fVar26 * (float)local_d8._0_4_;
              break;
            case 6:
              fVar1 = *pfVar5;
              fVar29 = (float)((uint)pfVar5[1] ^ auVar34._0_4_) / fVar1;
              fVar30 = 0.0;
              if ((fVar29 <= fVar26) && (fVar30 = fVar26, fVar26 <= fVar29 + 1.0 / fVar1)) {
                fVar30 = (fVar1 * fVar26 + pfVar5[1]) * fVar26;
              }
            }
            *(float *)((long)pvVar16 + uVar13 * 4) = fVar30;
            uVar13 = uVar13 + 1;
          } while (uVar19 != uVar13);
        }
        local_1a0 = local_1a0 + 1;
        uVar20 = uVar20 + local_180;
        pvVar23 = (void *)((long)pvVar23 + __n * 4);
        pvVar16 = (void *)((long)pvVar16 + local_180);
        uVar13 = local_180;
      } while (local_1a0 != local_150);
    }
  }
  else {
    uVar4 = (long)(int)uVar2 / (long)group;
    iVar12 = (int)uVar4;
    uVar13 = uVar4 & 0xffffffff;
    if (0 < group) {
      local_158 = (long)(int)local_170 / (long)group & 0xffffffff;
      iVar14 = top_blob->w;
      local_f0 = top_blob->d;
      local_c0 = top_blob->data;
      local_70 = top_blob->elemsize;
      local_150 = top_blob->cstep * local_70;
      local_78 = (long)top_blob->h * (long)iVar14;
      local_80 = local_70 * local_78 + 0xf & 0xfffffffffffffff0;
      local_f4 = top_blob->dims;
      local_88 = weight_data->data;
      local_180 = (ulong)(uint)(top_blob->h * iVar14);
      local_160 = (ulong)stride_w;
      local_168 = (long)stride_h * (long)iVar14 * local_70;
      iVar14 = (int)((long)(int)local_170 / (long)group);
      local_90 = (long)iVar14;
      local_60 = (ulong)(uint)group;
      local_68 = local_150 * local_90;
      local_ec = iVar14 * iVar12 * uVar24;
      local_50 = (long)(int)(iVar12 * uVar24) << 2;
      local_b0 = local_138->data;
      local_170 = (ulong)*(uint *)(local_e8._0_8_ + 0x2c);
      local_178 = (ulong)*(uint *)(local_e8._0_8_ + 0x30);
      local_b8 = (long)local_c0 + 0xc;
      local_128 = 0;
      local_130 = 0;
      auVar31 = _DAT_005a25a0;
      auVar32 = _DAT_005a25b0;
      auVar33 = _DAT_005a24a0;
      local_58 = local_c0;
      do {
        if (0 < (int)local_158) {
          local_198 = (void *)((long)local_88 + (long)(int)local_128 * 4);
          local_108 = local_130 * local_90;
          iVar14 = (int)local_78;
          if (local_f4 != 4) {
            iVar14 = (int)(local_80 / local_70);
          }
          local_118 = (void *)(ulong)(uint)(iVar14 * local_f0);
          iVar15 = (int)local_130;
          local_110 = CONCAT71(local_110._1_7_,
                               (long)local_138->c * local_138->cstep == 0 || local_b0 == (void *)0x0
                              );
          local_120 = (void *)(ulong)(iVar14 * local_f0 + 3U & 0xfffffffc);
          lVar18 = (long)local_118 - 1;
          auVar34._8_4_ = (int)lVar18;
          auVar34._0_8_ = lVar18;
          auVar34._12_4_ = (int)((ulong)lVar18 >> 0x20);
          auVar34 = auVar34 ^ auVar33;
          uVar13 = 0;
          pvVar23 = local_c0;
          lVar18 = local_b8;
          local_a8 = auVar34;
          do {
            uVar25 = 0;
            if ((char)local_110 == '\0') {
              uVar25 = *(undefined4 *)((long)local_b0 + (uVar13 + local_108) * 4);
            }
            if (0 < (int)local_118) {
              pvVar16 = (void *)0x0;
              do {
                auVar27._8_4_ = (int)pvVar16;
                auVar27._0_8_ = pvVar16;
                auVar27._12_4_ = (int)((ulong)pvVar16 >> 0x20);
                auVar28 = (auVar27 | auVar32) ^ auVar33;
                iVar17 = auVar34._0_4_;
                bVar9 = iVar17 < auVar28._0_4_;
                iVar14 = auVar28._4_4_;
                iVar35 = auVar34._4_4_;
                if ((bool)(~(iVar35 < iVar14 || iVar14 == iVar35 && bVar9) & 1)) {
                  *(undefined4 *)(lVar18 + -0xc + (long)pvVar16 * 4) = uVar25;
                }
                if (iVar35 >= iVar14 && (iVar14 != iVar35 || !bVar9)) {
                  *(undefined4 *)(lVar18 + -8 + (long)pvVar16 * 4) = uVar25;
                }
                auVar27 = (auVar27 | auVar31) ^ auVar33;
                iVar14 = auVar27._4_4_;
                if (iVar14 <= iVar35 && (iVar14 != iVar35 || auVar27._0_4_ <= iVar17)) {
                  *(undefined4 *)(lVar18 + -4 + (long)pvVar16 * 4) = uVar25;
                  *(undefined4 *)(lVar18 + (long)pvVar16 * 4) = uVar25;
                }
                pvVar16 = (void *)((long)pvVar16 + 4);
              } while (local_120 != pvVar16);
            }
            local_d8._0_8_ = pvVar23;
            if (0 < (int)local_178) {
              pvVar16 = (void *)((uVar13 + local_108) * local_150 + (long)local_58);
              local_148._0_8_ = pvVar16;
              local_1b0 = 0;
              do {
                if (0 < (int)local_170) {
                  iVar14 = *(int *)(local_e8._0_8_ + 0x2c);
                  lVar6 = *(long *)(local_e8._0_8_ + 0x10);
                  lVar7 = *(long *)(local_e8._0_8_ + 0x40);
                  lVar8 = *(long *)local_e8._0_8_;
                  uVar20 = 0;
                  do {
                    if (0 < iVar12) {
                      lVar10 = uVar20 * local_160 * 4 + local_1b0 * local_168;
                      uVar19 = 0;
                      pvVar22 = local_198;
                      do {
                        if (0 < (int)uVar24) {
                          fVar26 = *(float *)((long)iVar14 * local_1b0 * lVar6 + lVar8 + uVar20 * 4
                                             + (uVar19 + (uint)(iVar12 * iVar15)) * lVar7 * lVar6);
                          uVar21 = 0;
                          do {
                            *(float *)((long)pvVar16 +
                                      (long)local_48.super__Vector_base<int,_std::allocator<int>_>.
                                            _M_impl.super__Vector_impl_data._M_start[uVar21] * 4 +
                                      lVar10) =
                                 *(float *)((long)pvVar22 + uVar21 * 4) * fVar26 +
                                 *(float *)((long)pvVar16 +
                                           (long)local_48.
                                                 super__Vector_base<int,_std::allocator<int>_>.
                                                 _M_impl.super__Vector_impl_data._M_start[uVar21] *
                                           4 + lVar10);
                            uVar21 = uVar21 + 1;
                          } while (uVar24 != uVar21);
                        }
                        uVar19 = uVar19 + 1;
                        pvVar22 = (void *)((long)pvVar22 + __n * 4);
                      } while (uVar19 != (uVar4 & 0xffffffff));
                    }
                    uVar20 = uVar20 + 1;
                  } while (uVar20 != local_170);
                }
                local_1b0 = local_1b0 + 1;
              } while (local_1b0 != local_178);
            }
            local_100 = uVar13;
            if (0 < (int)local_180) {
              pfVar5 = (float *)activation_params->data;
              uVar20 = 0;
              uVar13 = local_180;
              do {
                fVar26 = *(float *)((long)pvVar23 + uVar20 * 4);
                fVar30 = fVar26;
                switch(activation_type) {
                case 1:
                  if (fVar26 <= 0.0) {
                    fVar30 = 0.0;
                  }
                  break;
                case 2:
                  fVar30 = (float)(~-(uint)(0.0 < fVar26) & (uint)*pfVar5 |
                                  -(uint)(0.0 < fVar26) & 0x3f800000) * fVar26;
                  break;
                case 3:
                  if (fVar26 <= *pfVar5) {
                    fVar26 = *pfVar5;
                  }
                  fVar30 = pfVar5[1];
                  if (fVar26 <= pfVar5[1]) {
                    fVar30 = fVar26;
                  }
                  break;
                case 4:
                  if (88.37626 <= fVar26) {
                    fVar26 = 88.37626;
                  }
                  fVar26 = expf((float)(-(uint)(fVar26 < -88.37626) & 0x42b0c0a5 |
                                       ~-(uint)(fVar26 < -88.37626) & ((uint)fVar26 ^ auVar33._0_4_)
                                       ));
                  pvVar23 = (void *)local_d8._0_8_;
                  uVar13 = local_180;
                  auVar31 = _DAT_005a25a0;
                  auVar32 = _DAT_005a25b0;
                  auVar33 = _DAT_005a24a0;
                  auVar34 = local_a8;
                  fVar30 = 1.0 / (fVar26 + 1.0);
                  break;
                case 5:
                  local_148 = ZEXT416((uint)fVar26);
                  fVar26 = expf(fVar26);
                  fVar26 = logf(fVar26 + 1.0);
                  fVar26 = tanhf(fVar26);
                  pvVar23 = (void *)local_d8._0_8_;
                  uVar13 = local_180;
                  auVar31 = _DAT_005a25a0;
                  auVar32 = _DAT_005a25b0;
                  auVar33 = _DAT_005a24a0;
                  auVar34 = local_a8;
                  fVar30 = fVar26 * (float)local_148._0_4_;
                  break;
                case 6:
                  fVar1 = *pfVar5;
                  fVar29 = (float)((uint)pfVar5[1] ^ auVar33._0_4_) / fVar1;
                  fVar30 = 0.0;
                  if ((fVar29 <= fVar26) && (fVar30 = fVar26, fVar26 <= fVar29 + 1.0 / fVar1)) {
                    fVar30 = (fVar1 * fVar26 + pfVar5[1]) * fVar26;
                  }
                }
                *(float *)((long)pvVar23 + uVar20 * 4) = fVar30;
                uVar20 = uVar20 + 1;
              } while (uVar13 != uVar20);
            }
            uVar13 = local_100 + 1;
            lVar18 = lVar18 + local_150;
            local_198 = (void *)((long)local_198 + local_50);
            pvVar23 = (void *)((long)pvVar23 + local_150);
          } while (uVar13 != local_158);
        }
        local_130 = local_130 + 1;
        local_b8 = local_b8 + local_68;
        local_128 = (ulong)(uint)((int)local_128 + local_ec);
        local_c0 = (void *)((long)local_c0 + local_68);
        uVar13 = local_68;
      } while (local_130 != local_60);
    }
  }
  iVar12 = (int)uVar13;
  if (local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
    iVar12 = extraout_EAX;
  }
  return iVar12;
}

Assistant:

static int deconvolutiondepthwise(const Mat& bottom_blob, Mat& top_blob, const Mat& weight_data, const Mat& bias_data, int kernel_w, int kernel_h, int stride_w, int stride_h, int dilation_w, int dilation_h, int group, int activation_type, const Mat& activation_params, const Option& opt)
{
    const int inch = bottom_blob.c;

    const int outw = top_blob.w;
    const int outch = top_blob.c;

    const int maxk = kernel_w * kernel_h;

    // kernel offsets
    std::vector<int> _space_ofs(maxk);
    int* space_ofs = &_space_ofs[0];
    {
        int p1 = 0;
        int p2 = 0;
        int gap = outw * dilation_h - kernel_w * dilation_w;
        for (int i = 0; i < kernel_h; i++)
        {
            for (int j = 0; j < kernel_w; j++)
            {
                space_ofs[p1] = p2;
                p1++;
                p2 += dilation_w;
            }
            p2 += gap;
        }
    }

    // depth-wise
    if (inch == group && group == outch)
    {
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int g = 0; g < group; g++)
        {
            const float* inptr = bottom_blob.channel(g);
            const float* kptr = (const float*)weight_data + maxk * g;
            Mat out = top_blob.channel(g);

            const float bias = bias_data.empty() ? 0.f : bias_data[g];

            out.fill(bias);

            // shadowed variable for less openmp task args
            const int w = bottom_blob.w;
            const int h = bottom_blob.h;
            const int outw = top_blob.w;
            const int outh = top_blob.h;

            for (int i = 0; i < h; i++)
            {
                for (int j = 0; j < w; j++)
                {
                    float* outptr = out.row(i * stride_h) + j * stride_w;

                    const float val = inptr[i * w + j];

                    for (int k = 0; k < maxk; k++)
                    {
                        float w = kptr[k];
                        outptr[space_ofs[k]] += val * w;
                    }
                }
            }

            {
                float* outptr = out;
                int size = outw * outh;

                for (int i = 0; i < size; i++)
                {
                    outptr[i] = activation_ss(outptr[i], activation_type, activation_params);
                }
            }
        }
    }
    else
    {
        const int inch_g = inch / group;
        const int outch_g = outch / group;

#ifdef _WIN32
        #pragma omp parallel for num_threads(opt.num_threads)
#else
        #pragma omp parallel for collapse(2) num_threads(opt.num_threads)
#endif
        for (int g = 0; g < group; g++)
        {
            for (int p = 0; p < outch_g; p++)
            {
                Mat out = top_blob.channel(g * outch_g + p);

                const float* weight_data_ptr = (const float*)weight_data + maxk * inch_g * outch_g * g;

                const float bias = bias_data.empty() ? 0.f : bias_data[g * outch_g + p];

                out.fill(bias);

                // shadowed variable for less openmp task args
                const int w = bottom_blob.w;
                const int h = bottom_blob.h;
                const int outw = top_blob.w;
                const int outh = top_blob.h;

                for (int i = 0; i < h; i++)
                {
                    for (int j = 0; j < w; j++)
                    {
                        float* outptr = out.row(i * stride_h) + j * stride_w;

                        const float* kptr = weight_data_ptr + maxk * inch_g * p;

                        for (int q = 0; q < inch_g; q++)
                        {
                            const float val = bottom_blob.channel(inch_g * g + q).row(i)[j];

                            for (int k = 0; k < maxk; k++)
                            {
                                outptr[space_ofs[k]] += val * kptr[k];
                            }

                            kptr += maxk;
                        }
                    }
                }

                {
                    float* outptr = out;
                    int size = outw * outh;

                    for (int i = 0; i < size; i++)
                    {
                        outptr[i] = activation_ss(outptr[i], activation_type, activation_params);
                    }
                }
            }
        }
    }

    return 0;
}